

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O0

color * __thiscall
image_texture::value(color *__return_storage_ptr__,image_texture *this,double u,double v,point3 *p)

{
  point3 *ppVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  double dVar6;
  double color_scale;
  uchar *pixel;
  int j;
  int i;
  interval local_38;
  point3 *local_28;
  point3 *p_local;
  double v_local;
  double u_local;
  image_texture *this_local;
  
  local_28 = p;
  p_local = (point3 *)v;
  v_local = u;
  u_local = (double)this;
  iVar3 = rtw_image::height(&this->image);
  if (iVar3 < 1) {
    vec3::vec3(__return_storage_ptr__,0.0,1.0,1.0);
  }
  else {
    interval::interval(&local_38,0.0,1.0);
    v_local = interval::clamp(&local_38,v_local);
    interval::interval((interval *)&j,0.0,1.0);
    dVar6 = interval::clamp((interval *)&j,(double)p_local);
    dVar2 = v_local;
    p_local = (point3 *)(1.0 - dVar6);
    iVar3 = rtw_image::width(&this->image);
    ppVar1 = p_local;
    iVar4 = rtw_image::height(&this->image);
    pbVar5 = rtw_image::pixel_data
                       (&this->image,(int)(dVar2 * (double)iVar3),
                        (int)((double)ppVar1 * (double)iVar4));
    vec3::vec3(__return_storage_ptr__,(double)*pbVar5 * 0.00392156862745098,
               (double)pbVar5[1] * 0.00392156862745098,(double)pbVar5[2] * 0.00392156862745098);
  }
  return __return_storage_ptr__;
}

Assistant:

color value(double u, double v, const point3& p) const override {
        // If we have no texture data, then return solid cyan as a debugging aid.
        if (image.height() <= 0) return color(0,1,1);

        // Clamp input texture coordinates to [0,1] x [1,0]
        u = interval(0,1).clamp(u);
        v = 1.0 - interval(0,1).clamp(v);  // Flip V to image coordinates

        auto i = int(u * image.width());
        auto j = int(v * image.height());
        auto pixel = image.pixel_data(i,j);

        auto color_scale = 1.0 / 255.0;
        return color(color_scale*pixel[0], color_scale*pixel[1], color_scale*pixel[2]);
    }